

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCondition::IfcCondition(IfcCondition *this)

{
  *(undefined ***)&(this->super_IfcGroup).field_0xf0 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(char **)&this->field_0x100 = "IfcCondition";
  IfcGroup::IfcGroup(&this->super_IfcGroup,&PTR_construction_vtable_24__007dcce8);
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x7dcc08;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x7dccd0;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0x7dcc30;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x7dcc58;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xd0 = 0x7dcc80;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xe0 = 0x7dcca8;
  return;
}

Assistant:

IfcCondition() : Object("IfcCondition") {}